

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrsubr.c
# Opt level: O2

int UserSubr(int user_subr_index,int num_args,uint *args)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  printf("debug: case: 0x%x, args: 0x%x\n",user_subr_index,(ulong)(uint)num_args);
  uVar3 = (ulong)(uint)num_args;
  if (num_args < 1) {
    uVar3 = 0;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    printf("debug: arg[%d]: 0x%x\n",uVar2 & 0xffffffff,(ulong)args[uVar2]);
  }
  if (user_subr_index == 0) {
    puts("sample UFN");
    uVar1 = *args;
  }
  else {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int UserSubr(int user_subr_index, int num_args, unsigned *args) {
  int result = 0;

  /* *** remove the printf when finished debugging your user subr *** */

  printf("debug: case: 0x%x, args: 0x%x\n", user_subr_index, num_args);
  {
    int i;
    for (i = 0; i < num_args; i++) printf("debug: arg[%d]: 0x%x\n", i, args[i]);
  }

  switch (user_subr_index) {
    case 0:
      printf("sample UFN\n");
      result = args[0];
      break;
  default:
      return (-1); /* DO UFN */
  }

  return (result);
}